

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deserializer.hpp
# Opt level: O3

void __thiscall
duckdb::Deserializer::ReadProperty<duckdb::vector<long,true>>
          (Deserializer *this,field_id_t field_id,char *tag,vector<long,_true> *ret)

{
  pointer plVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined6 in_register_00000032;
  long lVar3;
  vector<long,_std::allocator<long>_> local_48;
  long local_30;
  
  (*this->_vptr_Deserializer[2])(this,CONCAT62(in_register_00000032,field_id));
  local_48.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  local_48.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  local_48.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  iVar2 = (*this->_vptr_Deserializer[8])(this);
  lVar3 = CONCAT44(extraout_var,iVar2);
  if (lVar3 != 0) {
    do {
      iVar2 = (*this->_vptr_Deserializer[0x14])(this);
      local_30 = CONCAT44(extraout_var_00,iVar2);
      if (local_48.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_finish ==
          local_48.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        ::std::vector<long,_std::allocator<long>_>::_M_realloc_insert<long>
                  (&local_48,
                   (iterator)
                   local_48.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                   super__Vector_impl_data._M_finish,&local_30);
      }
      else {
        *local_48.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
         _M_finish = local_30;
        local_48.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
        _M_finish = local_48.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_finish + 1;
      }
      lVar3 = lVar3 + -1;
    } while (lVar3 != 0);
  }
  (*this->_vptr_Deserializer[9])(this);
  plVar1 = (ret->super_vector<long,_std::allocator<long>_>).
           super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start;
  (ret->super_vector<long,_std::allocator<long>_>).super__Vector_base<long,_std::allocator<long>_>.
  _M_impl.super__Vector_impl_data._M_start =
       local_48.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
       _M_start;
  (ret->super_vector<long,_std::allocator<long>_>).super__Vector_base<long,_std::allocator<long>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       local_48.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
       _M_finish;
  (ret->super_vector<long,_std::allocator<long>_>).super__Vector_base<long,_std::allocator<long>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       local_48.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage;
  local_48.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  local_48.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  local_48.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  if (plVar1 != (pointer)0x0) {
    operator_delete(plVar1);
    if (local_48.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_48.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  (*this->_vptr_Deserializer[3])(this);
  return;
}

Assistant:

inline void ReadProperty(const field_id_t field_id, const char *tag, T &ret) {
		OnPropertyBegin(field_id, tag);
		ret = Read<T>();
		OnPropertyEnd();
	}